

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int write_crypto_data(quicly_conn_t *conn,ptls_buffer_t *tlsbuf,size_t *epoch_offsets)

{
  size_t sVar1;
  int in_EAX;
  quicly_stream_t *stream;
  size_t *psVar2;
  size_t len;
  long stream_id;
  bool bVar3;
  
  if (tlsbuf->off != 0) {
    psVar2 = epoch_offsets + 1;
    stream_id = -1;
    do {
      sVar1 = psVar2[-1];
      bVar3 = false;
      len = *psVar2 - sVar1;
      if (len != 0) {
        stream = quicly_get_stream(conn,stream_id);
        if (stream == (quicly_stream_t *)0x0) {
          __assert_fail("stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x3ae,"int write_crypto_data(quicly_conn_t *, ptls_buffer_t *, size_t *)");
        }
        in_EAX = quicly_sendbuf_write
                           (stream,(quicly_sendbuf_t *)stream->data,tlsbuf->base + sVar1,len);
        bVar3 = in_EAX != 0;
      }
      if (bVar3) {
        return in_EAX;
      }
      psVar2 = psVar2 + 1;
      stream_id = stream_id + -1;
    } while (stream_id != -5);
  }
  return in_EAX;
}

Assistant:

static int write_crypto_data(quicly_conn_t *conn, ptls_buffer_t *tlsbuf, size_t epoch_offsets[5])
{
    size_t epoch;
    int ret;

    if (tlsbuf->off == 0)
        return 0;

    for (epoch = 0; epoch < 4; ++epoch) {
        size_t len = epoch_offsets[epoch + 1] - epoch_offsets[epoch];
        if (len == 0)
            continue;
        quicly_stream_t *stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + epoch));
        assert(stream != NULL);
        if ((ret = quicly_streambuf_egress_write(stream, tlsbuf->base + epoch_offsets[epoch], len)) != 0)
            return ret;
    }

    return 0;
}